

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSat.c
# Opt level: O3

word If_ManSat6ComposeLut4(int t,word *f,int k)

{
  word wVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (k < 5) {
    uVar2 = 1 << ((byte)k & 0x1f);
    if ((int)uVar2 < 2) {
      uVar2 = 1;
    }
    wVar1 = 0;
    uVar3 = 0;
    do {
      if (((uint)t >> (uVar3 & 0x1f) & 1) != 0) {
        uVar4 = 0xffffffffffffffff;
        if (0 < k) {
          uVar5 = 0;
          do {
            uVar4 = uVar4 & ((ulong)((uVar3 >> ((uint)uVar5 & 0x1f) & 1) != 0) - 1 ^ f[uVar5]);
            uVar5 = uVar5 + 1;
          } while ((uint)k != uVar5);
        }
        wVar1 = wVar1 | uVar4;
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != uVar2);
    return wVar1;
  }
  __assert_fail("k <= 4",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/if/ifSat.c"
                ,0x6b,"word If_ManSat6ComposeLut4(int, word *, int)");
}

Assistant:

static word If_ManSat6ComposeLut4( int t, word f[4], int k )
{
    int m, v, nMints = (1 << k);
    word c, r = 0;
    assert( k <= 4 );
    for ( m = 0; m < nMints; m++ )
    {
        if ( !((t >> m) & 1) )
            continue;
        c = ~(word)0;
        for ( v = 0; v < k; v++ )
            c &= ((m >> v) & 1) ? f[v] : ~f[v];
        r |= c;
    }
    return r;
}